

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_DecryptAes256ToStringDataEmpty_Test::~CryptoUtil_DecryptAes256ToStringDataEmpty_Test
          (CryptoUtil_DecryptAes256ToStringDataEmpty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256ToStringDataEmpty) {
  try {
    ByteData key(
        "616975656F616975656F616975656F616975656F616975656F616975656F6169");
    ByteData data("");
    std::string result = CryptoUtil::DecryptAes256ToString(key.GetBytes(),
                                                           data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "DecryptAes256 error.");
    return;
  }
  ASSERT_TRUE(false);
}